

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O3

void __thiscall
TypeArgumentSet::TypeArgumentSet
          (TypeArgumentSet *this,InplaceStr name,IntrusiveList<TypeHandle> types)

{
  uint uVar1;
  
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_003e60b0;
  (this->super_TypeBase).typeID = 0x1b;
  (this->super_TypeBase).name.begin = name.begin;
  (this->super_TypeBase).name.end = name.end;
  (this->super_TypeBase).arrayTypes.head = (TypeHandle *)0x0;
  (this->super_TypeBase).arrayTypes.tail = (TypeHandle *)0x0;
  uVar1 = NULLC::GetStringHash(name.begin,name.end);
  (this->super_TypeBase).nameHash = uVar1;
  (this->super_TypeBase).importModule = (ModuleData *)0x0;
  (this->super_TypeBase).typeIndex = 0xffffffff;
  (this->super_TypeBase).refType = (TypeRef *)0x0;
  (this->super_TypeBase).unsizedArrayType = (TypeUnsizedArray *)0x0;
  *(undefined8 *)&(this->super_TypeBase).alignment = 0;
  *(undefined8 *)((long)&(this->super_TypeBase).size + 4) = 0;
  *(undefined4 *)((long)&(this->super_TypeBase).padding + 3) = 0;
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_003e6940;
  (this->types).head = types.head;
  (this->types).tail = types.tail;
  (this->super_TypeBase).isGeneric = true;
  return;
}

Assistant:

TypeArgumentSet(InplaceStr name, IntrusiveList<TypeHandle> types): TypeBase(myTypeID, name), types(types)
	{
		isGeneric = true;
	}